

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

plutovg_path_element_t *
plutovg_path_add_command(plutovg_path_t *path,plutovg_path_command_t command,int npoints)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  plutovg_path_element_t *ppVar5;
  int iVar6;
  
  iVar1 = npoints + 1;
  iVar4 = (path->elements).size + iVar1;
  iVar6 = (path->elements).capacity;
  if (iVar6 < iVar4) {
    iVar3 = 8;
    if (iVar6 != 0) {
      iVar3 = iVar6;
    }
    do {
      iVar6 = iVar3;
      iVar3 = iVar6 * 2;
    } while (iVar6 < iVar4);
    ppVar5 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar6 << 3);
    (path->elements).data = ppVar5;
    (path->elements).capacity = iVar6;
  }
  ppVar5 = (path->elements).data + (path->elements).size;
  (ppVar5->header).command = command;
  *(int *)((long)ppVar5 + 4) = iVar1;
  piVar2 = &(path->elements).size;
  *piVar2 = *piVar2 + iVar1;
  path->num_points = path->num_points + npoints;
  return ppVar5 + 1;
}

Assistant:

static plutovg_path_element_t* plutovg_path_add_command(plutovg_path_t* path, plutovg_path_command_t command, int npoints)
{
    const int length = npoints + 1;
    plutovg_array_ensure(path->elements, length);
    plutovg_path_element_t* elements = path->elements.data + path->elements.size;
    elements->header.command = command;
    elements->header.length = length;
    path->elements.size += length;
    path->num_points += npoints;
    return elements + 1;
}